

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.hpp
# Opt level: O2

string * __thiscall
antlr::RecognitionException::getFilename_abi_cxx11_
          (string *__return_storage_ptr__,RecognitionException *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->fileName);
  return __return_storage_ptr__;
}

Assistant:

string getFilename() const throw()
		{
			return fileName;
		}